

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvmArray(LlvmCompilationContext *ctx,ExprArray *node)

{
  TypeBase *targetType;
  ExpressionContext *pEVar1;
  LLVMValueRef pLVar2;
  long lVar3;
  TypeBase *valueType;
  ExprBase *expression;
  
  CompileLlvmType(ctx,(node->super_ExprBase).type);
  expression = (node->values).head;
  do {
    if (expression == (ExprBase *)0x0) {
      pLVar2 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
      return pLVar2;
    }
    pLVar2 = CompileLlvm(ctx,expression);
    targetType = expression->type;
    pEVar1 = ctx->ctx;
    lVar3 = 0x89d8;
    if (((pEVar1->typeBool == targetType) || (pEVar1->typeChar == targetType)) ||
       (pEVar1->typeShort == targetType)) {
LAB_001984b0:
      valueType = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar3 + -0x30);
    }
    else {
      valueType = targetType;
      if (pEVar1->typeFloat == targetType) {
        lVar3 = 0x89f0;
        goto LAB_001984b0;
      }
    }
    ConvertToDataType(ctx,pLVar2,valueType,targetType);
    expression = expression->next;
  } while( true );
}

Assistant:

LLVMValueRef CompileLlvmArray(LlvmCompilationContext &ctx, ExprArray *node)
{
	LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, node->type), "arr_lit");

	unsigned i = 0;

	for(ExprBase *value = node->values.head; value; value = value->next)
	{
		LLVMValueRef element = CompileLlvm(ctx, value);

		LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), i, true) };

		LLVMValueRef address = LLVMBuildGEP(ctx.builder, storage, indices, 2, "");

		element = ConvertToDataType(ctx, element, GetStackType(ctx, value->type), value->type);

		LLVMBuildStore(ctx.builder, element, address);

		i++;
	}

	LLVMValueRef result = LLVMBuildLoad(ctx.builder, storage, "");

	return CheckType(ctx, node, result);
}